

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O2

GLFWbool chooseEGLConfig(_GLFWctxconfig *ctxconfig,_GLFWfbconfig *desired,EGLConfig *result)

{
  EGLConfig config;
  uint uVar1;
  int iVar2;
  EGLConfig *__ptr;
  _GLFWfbconfig *p_Var3;
  long lVar4;
  uint uVar5;
  int nativeCount;
  _GLFWfbconfig *local_48;
  EGLConfig *local_40;
  _GLFWfbconfig *local_38;
  
  uVar5 = 0;
  local_38 = desired;
  (*_glfw.egl.GetConfigs)(_glfw.egl.display,(EGLConfig *)0x0,0,&nativeCount);
  iVar2 = nativeCount;
  if ((long)nativeCount == 0) {
    uVar5 = 0;
    _glfwInputError(0x10006,"EGL: No EGLConfigs returned");
  }
  else {
    local_40 = result;
    __ptr = (EGLConfig *)calloc((long)nativeCount,8);
    (*_glfw.egl.GetConfigs)(_glfw.egl.display,__ptr,iVar2,&nativeCount);
    iVar2 = nativeCount;
    local_48 = (_GLFWfbconfig *)calloc((long)nativeCount,0x48);
    for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
      config = __ptr[lVar4];
      uVar1 = getEGLConfigAttrib(config,0x303f);
      if ((((uVar1 & 0x308e) != 0) && (uVar1 = getEGLConfigAttrib(config,0x3033), (uVar1 & 4) != 0))
         && (iVar2 = getEGLConfigAttrib(config,0x302e), iVar2 != 0)) {
        if (ctxconfig->client == 0x30001) {
          uVar1 = getEGLConfigAttrib(config,0x3040);
          uVar1 = uVar1 & 8;
joined_r0x0011f37a:
          if (uVar1 == 0) goto LAB_0011f36c;
        }
        else if (ctxconfig->client == 0x30002) {
          iVar2 = ctxconfig->major;
          uVar1 = getEGLConfigAttrib(config,0x3040);
          if (iVar2 == 1) {
            uVar1 = uVar1 & 1;
          }
          else {
            uVar1 = uVar1 & 4;
          }
          goto joined_r0x0011f37a;
        }
        p_Var3 = local_48 + (int)uVar5;
        iVar2 = getEGLConfigAttrib(config,0x3024);
        p_Var3->redBits = iVar2;
        iVar2 = getEGLConfigAttrib(config,0x3023);
        p_Var3->greenBits = iVar2;
        iVar2 = getEGLConfigAttrib(config,0x3022);
        p_Var3->blueBits = iVar2;
        iVar2 = getEGLConfigAttrib(config,0x3021);
        p_Var3->alphaBits = iVar2;
        iVar2 = getEGLConfigAttrib(config,0x3025);
        p_Var3->depthBits = iVar2;
        iVar2 = getEGLConfigAttrib(config,0x3026);
        p_Var3->stencilBits = iVar2;
        iVar2 = getEGLConfigAttrib(config,0x3031);
        p_Var3->samples = iVar2;
        p_Var3->doublebuffer = 1;
        p_Var3->handle = (uintptr_t)config;
        uVar5 = uVar5 + 1;
      }
LAB_0011f36c:
      iVar2 = nativeCount;
    }
    p_Var3 = _glfwChooseFBConfig(local_38,local_48,uVar5);
    if (p_Var3 != (_GLFWfbconfig *)0x0) {
      *local_40 = (EGLConfig)p_Var3->handle;
    }
    uVar5 = (uint)(p_Var3 != (_GLFWfbconfig *)0x0);
    free(__ptr);
    free(local_48);
  }
  return uVar5;
}

Assistant:

static GLFWbool chooseEGLConfig(const _GLFWctxconfig* ctxconfig,
                                const _GLFWfbconfig* desired,
                                EGLConfig* result)
{
    EGLConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;

    eglGetConfigs(_glfw.egl.display, NULL, 0, &nativeCount);
    if (!nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "EGL: No EGLConfigs returned");
        return GLFW_FALSE;
    }

    nativeConfigs = calloc(nativeCount, sizeof(EGLConfig));
    eglGetConfigs(_glfw.egl.display, nativeConfigs, nativeCount, &nativeCount);

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const EGLConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGB(A) EGLConfigs
        if (!(getEGLConfigAttrib(n, EGL_COLOR_BUFFER_TYPE) & EGL_RGB_BUFFER))
            continue;

        // Only consider window EGLConfigs
        if (!(getEGLConfigAttrib(n, EGL_SURFACE_TYPE) & EGL_WINDOW_BIT))
            continue;

#if defined(_GLFW_X11)
        // Only consider EGLConfigs with associated Visuals
        if (!getEGLConfigAttrib(n, EGL_NATIVE_VISUAL_ID))
            continue;
#endif // _GLFW_X11

        if (ctxconfig->client == GLFW_OPENGL_ES_API)
        {
            if (ctxconfig->major == 1)
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES_BIT))
                    continue;
            }
            else
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES2_BIT))
                    continue;
            }
        }
        else if (ctxconfig->client == GLFW_OPENGL_API)
        {
            if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_BIT))
                continue;
        }

        u->redBits = getEGLConfigAttrib(n, EGL_RED_SIZE);
        u->greenBits = getEGLConfigAttrib(n, EGL_GREEN_SIZE);
        u->blueBits = getEGLConfigAttrib(n, EGL_BLUE_SIZE);

        u->alphaBits = getEGLConfigAttrib(n, EGL_ALPHA_SIZE);
        u->depthBits = getEGLConfigAttrib(n, EGL_DEPTH_SIZE);
        u->stencilBits = getEGLConfigAttrib(n, EGL_STENCIL_SIZE);

        u->samples = getEGLConfigAttrib(n, EGL_SAMPLES);
        u->doublebuffer = GLFW_TRUE;

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (EGLConfig) closest->handle;

    free(nativeConfigs);
    free(usableConfigs);

    return closest != NULL;
}